

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

void findOptimalFlags(char **FLAG,int height,int width,int *imax,int *jmax)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  
  if ((jmax != (int *)0x0 && (imax != (int *)0x0 && FLAG != (char **)0x0)) &&
     (width != 0 && height != 0)) {
    uVar7 = (ulong)(uint)height;
    pvVar5 = malloc((long)(short)height * 2);
    if (pvVar5 != (void *)0x0) {
      if (0 < height) {
        memset(pvVar5,0,uVar7 * 2);
      }
      uVar9 = (ulong)(uint)width;
      if (0 < width) {
        uVar6 = 0;
        do {
          if (1 < height) {
            pcVar2 = FLAG[uVar6];
            cVar10 = *pcVar2;
            uVar11 = 1;
            do {
              cVar1 = pcVar2[uVar11];
              if (cVar10 != cVar1) {
                *(undefined2 *)((long)pvVar5 + uVar11 * 2) = 1;
                cVar10 = cVar1;
              }
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar9);
      }
      iVar8 = 0;
      iVar3 = height;
      do {
        uVar12 = height - iVar8;
        iVar4 = iVar3;
        if (uVar12 == 0 || height < iVar8) break;
        uVar6 = 1;
        iVar4 = iVar8 + 1;
        if (iVar8 + 1 < height) {
          uVar11 = 1;
          do {
            if (*(short *)((long)pvVar5 + (ulong)(uint)(iVar8 + (int)uVar11) * 2) != 0) {
              uVar6 = uVar11;
              iVar4 = iVar8 + (int)uVar11;
              break;
            }
            uVar11 = uVar11 + 1;
            uVar6 = (ulong)uVar12;
            iVar4 = height;
          } while (uVar12 != uVar11);
        }
        iVar8 = iVar4;
        if ((int)uVar6 < iVar3) {
          iVar3 = (int)uVar6;
        }
        iVar4 = 1;
      } while (iVar3 != 1);
      free(pvVar5);
      iVar4 = (height * 2) / iVar4;
      iVar3 = *jmax;
      if (*jmax < iVar4) {
        iVar3 = iVar4;
      }
      pvVar5 = malloc((long)(short)width * 2);
      if (pvVar5 != (void *)0x0) {
        if (0 < width) {
          memset(pvVar5,0,uVar9 * 2);
        }
        if (0 < height) {
          uVar6 = 0;
          do {
            if (1 < width) {
              uVar11 = 1;
              cVar10 = (*FLAG)[uVar6];
              do {
                cVar1 = FLAG[uVar11][uVar6];
                if (cVar1 != cVar10) {
                  *(undefined2 *)((long)pvVar5 + uVar11 * 2) = 1;
                }
                uVar11 = uVar11 + 1;
                cVar10 = cVar1;
              } while (uVar9 != uVar11);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar7);
        }
        iVar8 = 0;
        uVar7 = (ulong)(uint)width;
        do {
          uVar12 = width - iVar8;
          iVar4 = (int)uVar7;
          if (uVar12 == 0 || width < iVar8) break;
          uVar9 = 1;
          iVar4 = iVar8 + 1;
          if (iVar8 + 1 < width) {
            uVar6 = 1;
            do {
              if (*(short *)((long)pvVar5 + (ulong)(uint)(iVar8 + (int)uVar6) * 2) != 0) {
                uVar9 = uVar6;
                iVar4 = iVar8 + (int)uVar6;
                break;
              }
              uVar6 = uVar6 + 1;
              uVar9 = (ulong)uVar12;
              iVar4 = width;
            } while (uVar12 != uVar6);
          }
          iVar8 = iVar4;
          if ((int)uVar9 < (int)uVar7) {
            uVar7 = uVar9 & 0xffffffff;
          }
          iVar4 = 1;
        } while ((int)uVar7 != 1);
        free(pvVar5);
        iVar4 = (width * 2) / iVar4;
        iVar8 = *imax;
        if (*imax < iVar4) {
          iVar8 = iVar4;
        }
        *jmax = iVar3;
        *imax = iVar8;
      }
    }
  }
  return;
}

Assistant:

void findOptimalFlags (char **FLAG, int height, int width, int *imax, int *jmax)
{
	if (!FLAG || !imax || !jmax)
		return;
	if (!height || !width)
		return;
	/* Find the structure size in y-direction */
	int blockType, blockSize = height;
	int newHeight, newWidth;
	int i, j;
	short *structureVec = malloc(((short)height)*sizeof(short));
	if (structureVec == NULL)
		return;
	for (j = 0; j < height; j++)
		structureVec[j] = 0;
	for (i = 0; i < width; i++)
	{
		blockType = FLAG[i][0];
		for (j = 1; j < height; j++)
		{
			if (FLAG[i][j] != blockType)
			{
				structureVec[j] = 1;
				blockType = FLAG[i][j];
			}
		}
	}
	for (j = 0; j < height; j+=i)
	{
		i = 1;
		while (j+i < height && structureVec[j+i] == 0)
		{
			i++;
		}
		if (i < blockSize)
			blockSize = i;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the height necessary to represent the image, but no less than *jmax */
	newHeight = (height * 2)/blockSize;
	if (newHeight < *jmax)
		newHeight = *jmax;
	/* Now do exactly the same thing for the x-direction */
	blockSize = width;
	structureVec = malloc((short)width*sizeof(short));
	if (structureVec == NULL)
		return;
	for (i = 0; i < width; i++)
		structureVec[i] = 0;
	for (j = 0; j < height; j++)
	{
		blockType = FLAG[0][j];
		for (i = 1; i < width; i++)
		{
			if (FLAG[i][j] != blockType)
				structureVec[i] = 1;
			blockType = FLAG[i][j];
		}
	}
	for (i = 0; i < width; i+=j)
	{
		j = 1;
		while (j+i < width && structureVec[j+i] == 0)
		{
			j++;
		}
		if (j < blockSize)
			blockSize = j;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the width necessary to represent the image, but no less than *imax */
	newWidth = (width * 2)/blockSize;
	if (newWidth < *imax)
		newWidth = *imax;
	*jmax = newHeight;
	*imax = newWidth;
	return;
}